

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<int,void,void>(ostream_base *this,int v)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  int v_local;
  ostream_base *this_local;
  
  if (v < 0) {
    write(this,0x2d,in_RDX,in_RCX);
    iVar1 = std::numeric_limits<int>::min();
    if (v == iVar1) {
      this_local = write<unsigned_int,void>(this,v);
    }
    else {
      this_local = write<unsigned_int,void>(this,-v);
    }
  }
  else {
    this_local = write<unsigned_int,void>(this,v);
  }
  return this_local;
}

Assistant:

ostream_base & write (Signed const v) {
                    using unsigned_type = typename std::make_unsigned<Signed>::type;
                    if (v < 0) {
                        this->write ('-');
                        if (v == std::numeric_limits<Signed>::min ()) {
                            return this->write (static_cast<unsigned_type> (v));
                        }
                        return this->write (static_cast<unsigned_type> (-v));
                    }
                    return this->write (static_cast<unsigned_type> (v));
                }